

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdebug.cpp
# Opt level: O1

void __thiscall QDebug::putUInt128(QDebug *this,void *p)

{
  Stream *this_00;
  undefined8 in_R8;
  undefined8 in_R9;
  char *string;
  ulong uVar1;
  long lVar2;
  long in_FS_OFFSET;
  undefined1 auVar3 [16];
  Int128Buffer buffer;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  undefined4 uVar7;
  undefined1 uVar8;
  undefined4 uStack_43;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  auVar3 = *p;
  uVar8 = 0xaa;
  uVar6 = 0xaaaaaaaa;
  uVar7 = 0xaaaaaaaa;
  uVar4 = 0xaaaaaaaa;
  uVar5 = 0xaaaaaaaa;
  this_00 = this->stream;
  uStack_43 = 0xaaaaaa;
  if (*p == 0 && *(long *)((long)p + 8) == 0) {
    string = (char *)((long)&uStack_43 + 2);
    uStack_43 = 0x30aaaa;
  }
  else {
    string = (char *)((long)&uStack_43 + 3);
    do {
      lVar2 = auVar3._8_8_;
      uVar1 = auVar3._0_8_;
      auVar3 = __udivti3(uVar1,lVar2,10,0,in_R8,in_R9,uVar4,uVar5,uVar6,uVar7,uVar8);
      string[-1] = "0123456789"[uVar1 + auVar3._0_8_ * -10];
      string = string + -1;
    } while (lVar2 != 0 || (ulong)-lVar2 < (ulong)(9 < uVar1));
  }
  ::QTextStream::operator<<(&this_00->ts,string);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QDebug::putUInt128([[maybe_unused]] const void *p)
{
#ifdef QT_SUPPORTS_INT128
    Q_ASSERT(p);
    quint128 i;
    memcpy(&i, p, sizeof(i)); // alignment paranoia
    Int128Buffer buffer;
    stream->ts << i128ToStringHelper(buffer, i);
    return;
#endif // QT_SUPPORTS_INT128
    stream->ts << int128Warning();
}